

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helicsPrimaryTypes.cpp
# Opt level: O3

void helics::valueExtract(data_view *data,DataType baseType,complex<double> *val)

{
  string_view val_00;
  ulong uVar1;
  undefined4 extraout_XMM0_Da;
  undefined4 uVar2;
  undefined4 extraout_XMM0_Da_00;
  undefined4 extraout_XMM0_Db;
  undefined4 uVar3;
  undefined4 extraout_XMM0_Db_00;
  undefined8 in_XMM1_Qa;
  undefined8 uVar4;
  string_view val_01;
  double val_1;
  undefined1 local_48 [56];
  
  switch(baseType) {
  case HELICS_DOUBLE:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(double *)local_48);
    break;
  case HELICS_INT:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)local_48);
    local_48._0_8_ = (undefined8)(long)local_48._0_8_;
    break;
  case HELICS_COMPLEX:
    local_48._0_8_ = 0.0;
    local_48._8_8_ = 0;
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(complex<double> *)local_48);
    *(undefined8 *)val->_M_value = local_48._0_8_;
    *(undefined8 *)(val->_M_value + 8) = local_48._8_8_;
    return;
  case HELICS_VECTOR:
    ValueConverter<std::vector<double,_std::allocator<double>_>_>::interpret
              ((vector<double,_std::allocator<double>_> *)local_48,data);
    uVar2 = 0;
    uVar3 = 0;
    if (local_48._8_8_ - local_48._0_8_ != 8) {
      if ((ulong)(local_48._8_8_ - local_48._0_8_) < 9) goto LAB_0025f2aa;
      uVar2 = (undefined4)*(undefined8 *)(local_48._0_8_ + 8);
      uVar3 = (undefined4)((ulong)*(undefined8 *)(local_48._0_8_ + 8) >> 0x20);
    }
    *(undefined8 *)val->_M_value = *(undefined8 *)local_48._0_8_;
    *(ulong *)(val->_M_value + 8) = CONCAT44(uVar3,uVar2);
    goto LAB_0025f2af;
  case HELICS_COMPLEX_VECTOR:
    ValueConverter<std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>_>::
    interpret((vector<std::complex<double>,_std::allocator<std::complex<double>_>_> *)local_48,data)
    ;
    if (local_48._0_8_ == local_48._8_8_) {
LAB_0025f2aa:
      if ((char *)local_48._0_8_ == (char *)0x0) {
        return;
      }
    }
    else {
      uVar4 = *(undefined8 *)(local_48._0_8_ + 8);
      *(undefined8 *)val->_M_value = *(undefined8 *)local_48._0_8_;
      *(undefined8 *)(val->_M_value + 8) = uVar4;
    }
LAB_0025f2af:
    uVar1 = local_48._16_8_ - local_48._0_8_;
LAB_0025f2b7:
    operator_delete((void *)local_48._0_8_,uVar1);
    return;
  case HELICS_NAMED_POINT:
    ValueConverter<helics::NamedPoint>::interpret((NamedPoint *)local_48,data);
    uVar2 = (undefined4)local_48._32_8_;
    uVar3 = SUB84(local_48._32_8_,4);
    uVar4 = 0;
    if (NAN((double)local_48._32_8_)) {
      val_01._M_str = (char *)local_48._0_8_;
      val_01._M_len = local_48._8_8_;
      helicsGetComplex(val_01);
      uVar2 = extraout_XMM0_Da_00;
      uVar3 = extraout_XMM0_Db_00;
    }
    *(ulong *)val->_M_value = CONCAT44(uVar3,uVar2);
    *(undefined8 *)(val->_M_value + 8) = uVar4;
    if (local_48._0_8_ == (long)local_48 + 0x10) {
      return;
    }
    uVar1 = local_48._16_8_ + 1;
    goto LAB_0025f2b7;
  case HELICS_BOOL:
    goto switchD_0025f0f7_caseD_7;
  case HELICS_TIME:
    detail::convertFromBinary((byte *)(data->dblock)._M_str,(int64_t *)local_48);
    *(double *)val->_M_value =
         (double)((long)local_48._0_8_ % 1000000000) * 1e-09 +
         (double)((long)local_48._0_8_ / 1000000000);
    goto LAB_0025f240;
  default:
    if (baseType == HELICS_JSON) {
      readJsonValue_abi_cxx11_((defV *)local_48,(helics *)data,(data_view *)val);
      valueExtract((defV *)local_48,val);
      CLI::std::__detail::__variant::
      _Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
      ::~_Variant_storage((_Variant_storage<false,_double,_long,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::complex<double>,_std::vector<double,_std::allocator<double>_>,_std::vector<std::complex<double>,_std::allocator<std::complex<double>_>_>,_helics::NamedPoint>
                           *)local_48);
      return;
    }
    goto switchD_0025f0f7_caseD_7;
  }
  *(undefined8 *)val->_M_value = local_48._0_8_;
LAB_0025f240:
  *(undefined8 *)(val->_M_value + 8) = 0;
  return;
switchD_0025f0f7_caseD_7:
  local_48._0_8_ = 0.0;
  local_48._8_8_ = (char *)0x0;
  detail::convertFromBinary((byte *)(data->dblock)._M_str,(string_view *)local_48);
  val_00._M_str = (char *)local_48._8_8_;
  val_00._M_len = local_48._0_8_;
  helicsGetComplex(val_00);
  *(ulong *)val->_M_value = CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
  *(undefined8 *)(val->_M_value + 8) = in_XMM1_Qa;
  return;
}

Assistant:

void valueExtract(const data_view& data, DataType baseType, std::complex<double>& val)
{
    switch (baseType) {
        case DataType::HELICS_DOUBLE: {
            val = std::complex<double>(ValueConverter<double>::interpret(data), 0.0);
            break;
        }
        case DataType::HELICS_INT: {
            val =
                std::complex<double>(static_cast<double>(ValueConverter<int64_t>::interpret(data)),
                                     0.0);
            break;
        }
        case DataType::HELICS_TIME: {
            const Time time(ValueConverter<int64_t>::interpret(data), time_units::ns);
            val = std::complex<double>(static_cast<double>(time), 0.0);
        } break;
        case DataType::HELICS_STRING:
        case DataType::HELICS_CHAR:
        default: {
            val = helicsGetComplex(ValueConverter<std::string_view>::interpret(data));
            break;
        }
        case DataType::HELICS_NAMED_POINT: {
            auto npval = ValueConverter<NamedPoint>::interpret(data);
            if (std::isnan(npval.value)) {
                val = helicsGetComplex(npval.name);
            } else {
                val = std::complex<double>(npval.value, 0.0);
            }
            break;
        }
        case DataType::HELICS_VECTOR: {
            auto vec = ValueConverter<std::vector<double>>::interpret(data);
            if (vec.size() == 1) {
                val = std::complex<double>(vec[0], 0.0);
            } else if (vec.size() >= 2) {
                val = std::complex<double>(vec[0], vec[1]);
            }
            break;
        }
        case DataType::HELICS_COMPLEX:
            val = ValueConverter<std::complex<double>>::interpret(data);
            break;
        case DataType::HELICS_COMPLEX_VECTOR: {
            auto cvec = ValueConverter<std::vector<std::complex<double>>>::interpret(data);
            if (!cvec.empty()) {
                val = cvec[0];
            }
            break;
        }
        case DataType::HELICS_JSON:
            valueExtract(readJsonValue(data), val);
            break;
    }
}